

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

void __thiscall caffe::V0LayerParameter::V0LayerParameter(V0LayerParameter *this)

{
  V0LayerParameter *pVVar1;
  V0LayerParameter *this_local;
  
  google::protobuf::Message::Message(&this->super_Message);
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__V0LayerParameter_00d507c0;
  google::protobuf::internal::InternalMetadataWithArena::InternalMetadataWithArena
            (&this->_internal_metadata_,(Arena *)0x0);
  memset(&this->_has_bits_,0,8);
  google::protobuf::RepeatedPtrField<caffe::BlobProto>::RepeatedPtrField(&this->blobs_);
  google::protobuf::RepeatedField<float>::RepeatedField(&this->blobs_lr_);
  google::protobuf::RepeatedField<float>::RepeatedField(&this->weight_decay_);
  pVVar1 = internal_default_instance();
  if (this != pVVar1) {
    protobuf_caffe_2eproto::InitDefaults();
  }
  SharedCtor(this);
  return;
}

Assistant:

V0LayerParameter::V0LayerParameter()
  : ::google::protobuf::Message(), _internal_metadata_(NULL) {
  if (GOOGLE_PREDICT_TRUE(this != internal_default_instance())) {
    protobuf_caffe_2eproto::InitDefaults();
  }
  SharedCtor();
  // @@protoc_insertion_point(constructor:caffe.V0LayerParameter)
}